

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O0

hash_type __thiscall libchess::Position::calculate_hash(Position *this)

{
  bool bVar1;
  value_type vVar2;
  uint64_t uVar3;
  optional<libchess::Square> oVar4;
  Position *in_RDI;
  optional<libchess::Square> ep_sq;
  Bitboard bb;
  PieceType pt;
  PieceType *__end3;
  PieceType *__begin3;
  PieceType (*__range3) [6];
  Color c;
  Color *__end2;
  Color *__begin2;
  Color (*__range2) [2];
  hash_type hash_value;
  Color in_stack_ffffffffffffff8c;
  _Storage<libchess::Square,_true> castling_rights;
  PieceType in_stack_ffffffffffffff90;
  Square in_stack_ffffffffffffff94;
  Color in_stack_ffffffffffffff98;
  Square in_stack_ffffffffffffff9c;
  Bitboard local_58;
  value_type local_4c;
  value_type *local_48;
  value_type *local_40;
  undefined4 *local_38;
  Square local_2c;
  value_type *local_28;
  value_type *local_20;
  undefined4 *local_18;
  ulong local_10;
  
  local_10 = 0;
  local_18 = &constants::COLORS;
  local_28 = (value_type *)&DAT_0013824c;
  for (local_20 = &constants::COLORS; local_20 != local_28; local_20 = local_20 + 1) {
    local_2c.super_MetaValueType<int>.value_ = (MetaValueType<int>)*local_20;
    local_38 = &constants::PIECE_TYPES;
    local_48 = (value_type *)&DAT_00138268;
    for (local_40 = &constants::PIECE_TYPES; local_40 != local_48; local_40 = local_40 + 1) {
      local_4c = *local_40;
      local_58 = piece_type_bb((Position *)
                               CONCAT44(in_stack_ffffffffffffff94.super_MetaValueType<int>.value_,
                                        in_stack_ffffffffffffff90.super_MetaValueType<int>.value_),
                               (PieceType)in_stack_ffffffffffffff9c.super_MetaValueType<int>.value_,
                               in_stack_ffffffffffffff98);
      while (vVar2 = Bitboard::operator_cast_to_unsigned_long(&local_58), vVar2 != 0) {
        in_stack_ffffffffffffff9c = Bitboard::forward_bitscan(in_RDI->piece_type_bb_);
        in_stack_ffffffffffffff94.super_MetaValueType<int>.value_ =
             local_2c.super_MetaValueType<int>.value_;
        in_stack_ffffffffffffff98.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)(MetaValueType<int>)local_4c;
        uVar3 = zobrist::piece_square_key
                          (local_2c,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        local_10 = uVar3 ^ local_10;
        Bitboard::forward_popbit(&local_58);
      }
    }
  }
  oVar4 = enpassant_square(in_RDI);
  castling_rights =
       oVar4.super__Optional_base<libchess::Square,_true,_true>._M_payload.
       super__Optional_payload_base<libchess::Square>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool((optional<libchess::Square> *)0x10ca17);
  if (bVar1) {
    std::optional<libchess::Square>::operator*((optional<libchess::Square> *)0x10ca27);
    uVar3 = zobrist::enpassant_key((Square)0x0);
    local_10 = uVar3 ^ local_10;
  }
  Position::castling_rights(in_RDI);
  uVar3 = zobrist::castling_rights_key
                    ((CastlingRights)castling_rights._M_value.super_MetaValueType<int>.value_);
  local_10 = uVar3 ^ local_10;
  side_to_move(in_RDI);
  uVar3 = zobrist::side_to_move_key((Color)0x0);
  return uVar3 ^ local_10;
}

Assistant:

hash_type calculate_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            for (PieceType pt : constants::PIECE_TYPES) {
                Bitboard bb = piece_type_bb(pt, c);
                while (bb) {
                    hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), pt, c);
                    bb.forward_popbit();
                }
            }
        }
        auto ep_sq = enpassant_square();
        if (ep_sq) {
            hash_value ^= zobrist::enpassant_key(*ep_sq);
        }
        hash_value ^= zobrist::castling_rights_key(castling_rights());
        hash_value ^= zobrist::side_to_move_key(side_to_move());
        return hash_value;
    }